

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O2

void __thiscall crsGA::ThreadPool::ThreadPool(ThreadPool *this,size_t threads)

{
  long lVar1;
  bool bVar2;
  anon_class_8_1_8991fb9c_for__M_head_impl local_40;
  thread local_38;
  
  (this->stop)._M_base._M_i = false;
  ThreadSafeQueue<std::function<void_()>_>::ThreadSafeQueue(&this->tasks);
  std::vector<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>::vector
            (&this->workers,threads,(allocator_type *)&local_38);
  lVar1 = 0;
  while (bVar2 = threads != 0, threads = threads - 1, bVar2) {
    local_40.this = this;
    std::thread::thread<crsGA::ThreadPool::ThreadPool(unsigned_long)::_lambda()_1_,,void>
              (&local_38,&local_40);
    std::thread::operator=
              ((thread *)
               ((long)&(((this->workers).
                         super__Vector_base<crsGA::ScopedThread,_std::allocator<crsGA::ScopedThread>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_t)._M_id._M_thread + lVar1),
               &local_38);
    std::thread::~thread(&local_38);
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

inline ThreadPool::ThreadPool(size_t threads) : stop(false),
                                                tasks(),
                                                workers(threads)
{
    for (size_t i = 0; i < threads; ++i)
        workers[i] = std::thread(
            [this] {
                while (!stop)
                {
                    runPendingTask();
                }
            });
}